

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *in_RSI;
  char *in_RDI;
  long *in_R8;
  long in_FS_OFFSET;
  TableAndFile *tf;
  Status *s;
  Table *table;
  RandomAccessFile *file;
  Slice key;
  string old_fname;
  string fname;
  char buf [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  Status *in_stack_fffffffffffffed0;
  Slice *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  Table **in_stack_ffffffffffffff70;
  uint64_t in_stack_ffffffffffffff78;
  RandomAccessFile *in_stack_ffffffffffffff80;
  Options *in_stack_ffffffffffffff88;
  long *local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Status::Status((Status *)in_stack_fffffffffffffec8);
  EncodeFixed64((char *)in_stack_fffffffffffffed0,(uint64_t)in_stack_fffffffffffffed8);
  Slice::Slice(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
               (size_t)in_stack_fffffffffffffec8);
  lVar2 = (**(code **)(*(long *)in_RSI[6] + 0x18))((long *)in_RSI[6],local_60);
  *in_R8 = lVar2;
  if (*in_R8 == 0) {
    TableFileName(in_stack_fffffffffffffee0,(uint64_t)in_stack_fffffffffffffed8);
    local_68 = (long *)0x0;
    (**(code **)(*(long *)*in_RSI + 0x18))
              (&stack0xffffffffffffff88,(long *)*in_RSI,local_30,&local_68);
    Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Status::~Status((Status *)in_stack_fffffffffffffec8);
    bVar1 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if (!bVar1) {
      SSTTableFileName(in_stack_fffffffffffffee0,(uint64_t)in_stack_fffffffffffffed8);
      (**(code **)(*(long *)*in_RSI + 0x18))
                (&stack0xffffffffffffff80,(long *)*in_RSI,local_50,&local_68);
      bVar1 = Status::ok((Status *)in_stack_fffffffffffffec8);
      Status::~Status((Status *)in_stack_fffffffffffffec8);
      if (bVar1) {
        Status::OK();
        Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        Status::~Status((Status *)in_stack_fffffffffffffec8);
      }
      std::__cxx11::string::~string(in_stack_fffffffffffffec8);
    }
    bVar1 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if (bVar1) {
      Table::Open(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffff70);
      Status::operator=((Status *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      Status::~Status((Status *)in_stack_fffffffffffffec8);
    }
    bVar1 = Status::ok((Status *)in_stack_fffffffffffffec8);
    if (bVar1) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = local_68;
      puVar3[1] = 0;
      lVar2 = (**(code **)(*(long *)in_RSI[6] + 0x10))
                        ((long *)in_RSI[6],local_60,puVar3,1,DeleteEntry);
      *in_R8 = lVar2;
    }
    else if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffec8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}